

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicssceneindex.cpp
# Opt level: O0

bool QtPrivate::intersect_rect
               (QGraphicsItem *item,QRectF *exposeRect,ItemSelectionMode mode,
               QTransform *deviceTransform,void *intersectData)

{
  bool bVar1;
  uint uVar2;
  QGraphicsItemPrivate *this;
  QTransform *in_RCX;
  int in_EDX;
  QGraphicsItem *in_RSI;
  long *in_RDI;
  undefined8 *in_R8;
  long in_FS_OFFSET;
  QRectF *this_00;
  qreal qVar3;
  qreal qVar4;
  QGraphicsItemPrivate *itemd;
  bool keep;
  QPainterPath rectPath;
  QRectF itemSceneBoundingRect;
  QPainterPath itemPath;
  QRectF itemRect;
  QRectF brect;
  QRectF sceneRect;
  QTransform transform;
  undefined7 in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdbf;
  QRectF *in_stack_fffffffffffffdc0;
  undefined7 in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdcf;
  byte bVar5;
  bool local_221;
  bool local_209;
  QTransform *pQVar6;
  ItemSelectionMode IVar7;
  undefined4 in_stack_fffffffffffffe08;
  QPainterPath local_1e0 [8];
  undefined1 *local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined1 *local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_158;
  undefined8 local_150;
  bool local_148 [80];
  bool local_f8 [80];
  QTransform local_a8;
  undefined1 local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_168 = *in_R8;
  local_160 = in_R8[1];
  local_158 = in_R8[2];
  local_150 = in_R8[3];
  local_188 = 0xffffffffffffffff;
  local_180 = 0xffffffffffffffff;
  local_178 = 0xffffffffffffffff;
  local_170 = 0xffffffffffffffff;
  (**(code **)(*in_RDI + 0x18))(&local_188);
  _q_adjustRect((QRectF *)0xa272b0);
  this = QGraphicsItemPrivate::get((QGraphicsItem *)0xa272bf);
  bVar1 = QGraphicsItemPrivate::itemIsUntransformable(this);
  if (bVar1) {
    memcpy(local_58,&DAT_00b47448,0x50);
    QGraphicsItem::deviceTransform(in_RSI,(QTransform *)CONCAT44(in_EDX,in_stack_fffffffffffffe08));
    local_1a8 = 0xffffffffffffffff;
    local_1a0 = 0xffffffffffffffff;
    local_198 = 0xffffffffffffffff;
    local_190 = 0xffffffffffffffff;
    pQVar6 = in_RCX;
    QTransform::inverted(local_f8);
    IVar7 = (ItemSelectionMode)((ulong)pQVar6 >> 0x20);
    QTransform::operator*(&local_a8,in_RCX);
    QTransform::mapRect((QRectF *)&local_1a8);
    if ((in_EDX == 0) || (in_EDX == 2)) {
      uVar2 = QRectF::contains((QRectF *)&local_1a8);
      local_221 = false;
      if ((uVar2 & 1) != 0) {
        local_221 = ::operator!=(in_stack_fffffffffffffdc0,
                                 (QRectF *)
                                 CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
      }
      local_209 = local_221;
    }
    else {
      bVar5 = QRectF::intersects((QRectF *)&local_1a8);
      local_209 = (bool)(bVar5 & 1);
    }
    if ((local_209 != false) && ((in_EDX == 0 || (in_EDX == 1)))) {
      local_1b0 = &DAT_aaaaaaaaaaaaaaaa;
      QPainterPath::QPainterPath((QPainterPath *)&local_1b0);
      QPainterPath::addRect((QRectF *)&local_1b0);
      local_209 = QGraphicsSceneIndexPrivate::itemCollidesWithPath
                            (in_RSI,(QPainterPath *)CONCAT44(in_EDX,in_stack_fffffffffffffe08),IVar7
                            );
      QPainterPath::~QPainterPath((QPainterPath *)&local_1b0);
    }
  }
  else {
    local_1d0 = 0xffffffffffffffff;
    local_1c8 = 0xffffffffffffffff;
    local_1c0 = 0xffffffffffffffff;
    local_1b8 = 0xffffffffffffffff;
    if ((*(ulong *)&this->field_0x160 >> 0x3e & 1) == 0) {
      QTransform::mapRect((QRectF *)&local_1d0);
      IVar7 = (ItemSelectionMode)((ulong)in_RCX >> 0x20);
    }
    else {
      this_00 = (QRectF *)QTransform::dx(&this->sceneTransform);
      IVar7 = (ItemSelectionMode)((ulong)in_RCX >> 0x20);
      QTransform::dy(&this->sceneTransform);
      QRectF::translated(this_00,(qreal)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8
                                                ),(qreal)in_stack_fffffffffffffdc0);
    }
    if ((in_EDX == 0) || (in_EDX == 2)) {
      bVar1 = ::operator!=(in_stack_fffffffffffffdc0,
                           (QRectF *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
      bVar5 = 0;
      if (bVar1) {
        bVar5 = QRectF::contains((QRectF *)&local_168);
      }
    }
    else {
      bVar5 = QRectF::intersects((QRectF *)&local_168);
    }
    local_209 = (bool)(bVar5 & 1);
    if ((local_209 != false) && ((in_EDX == 0 || (in_EDX == 1)))) {
      local_1d8 = &DAT_aaaaaaaaaaaaaaaa;
      QPainterPath::QPainterPath((QPainterPath *)&local_1d8);
      QPainterPath::addRect((QRectF *)&local_1d8);
      if ((*(ulong *)&this->field_0x160 >> 0x3e & 1) == 0) {
        QTransform::inverted(local_148);
        QTransform::map(local_1e0);
        QPainterPath::operator=
                  ((QPainterPath *)in_stack_fffffffffffffdc0,
                   (QPainterPath *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
        QPainterPath::~QPainterPath(local_1e0);
      }
      else {
        qVar3 = QTransform::dx(&this->sceneTransform);
        qVar3 = -qVar3;
        qVar4 = QTransform::dy(&this->sceneTransform);
        QPainterPath::translate(qVar3,-qVar4);
      }
      local_209 = QGraphicsSceneIndexPrivate::itemCollidesWithPath
                            (in_RSI,(QPainterPath *)CONCAT44(in_EDX,in_stack_fffffffffffffe08),IVar7
                            );
      QPainterPath::~QPainterPath((QPainterPath *)&local_1d8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_209;
}

Assistant:

static bool intersect_rect(const QGraphicsItem *item, const QRectF &exposeRect, Qt::ItemSelectionMode mode,
                               const QTransform &deviceTransform, const void *intersectData)
    {
        const QRectF sceneRect = *static_cast<const QRectF *>(intersectData);

        QRectF brect = item->boundingRect();
        _q_adjustRect(&brect);

        // ### Add test for this (without making things slower?)
        Q_UNUSED(exposeRect);

        bool keep = true;
        const QGraphicsItemPrivate *itemd = QGraphicsItemPrivate::get(item);
        if (itemd->itemIsUntransformable()) {
            // Untransformable items; map the scene rect to item coordinates.
            const QTransform transform = item->deviceTransform(deviceTransform);
            QRectF itemRect = (deviceTransform * transform.inverted()).mapRect(sceneRect);
            if (mode == Qt::ContainsItemShape || mode == Qt::ContainsItemBoundingRect)
                keep = itemRect.contains(brect) && itemRect != brect;
            else
                keep = itemRect.intersects(brect);
            if (keep && (mode == Qt::ContainsItemShape || mode == Qt::IntersectsItemShape)) {
                QPainterPath itemPath;
                itemPath.addRect(itemRect);
                keep = QGraphicsSceneIndexPrivate::itemCollidesWithPath(item, itemPath, mode);
            }
        } else {
            Q_ASSERT(!itemd->dirtySceneTransform);
            const QRectF itemSceneBoundingRect = itemd->sceneTransformTranslateOnly
                                               ? brect.translated(itemd->sceneTransform.dx(),
                                                                  itemd->sceneTransform.dy())
                                               : itemd->sceneTransform.mapRect(brect);
            if (mode == Qt::ContainsItemShape || mode == Qt::ContainsItemBoundingRect)
                keep = sceneRect != brect && sceneRect.contains(itemSceneBoundingRect);
            else
                keep = sceneRect.intersects(itemSceneBoundingRect);
            if (keep && (mode == Qt::ContainsItemShape || mode == Qt::IntersectsItemShape)) {
                QPainterPath rectPath;
                rectPath.addRect(sceneRect);
                if (itemd->sceneTransformTranslateOnly)
                    rectPath.translate(-itemd->sceneTransform.dx(), -itemd->sceneTransform.dy());
                else
                    rectPath = itemd->sceneTransform.inverted().map(rectPath);
                keep = QGraphicsSceneIndexPrivate::itemCollidesWithPath(item, rectPath, mode);
            }
        }
        return keep;
    }